

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O3

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::isMutableTextureTestable
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  uint uVar1;
  
  uVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[2])();
  return (uVar1 & 0x300) != 0;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeRTComputeShader::isMutableTextureTestable(void)
{
	/**
	 * Mutable textures cannot be bound as image textures on ES, but can be on
	 * desktop GL. This check enables/disables testing of mutable image textures.
	 */
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		return true;
	}
	else
	{
		return false;
	}
}